

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

re2 * __thiscall re2::FlattenedProgToString_abi_cxx11_(re2 *this,Prog *prog,int start)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  Inst local_80 [4];
  Inst local_60 [4];
  Inst *local_40;
  Inst *ip;
  uint local_24;
  undefined1 local_1d;
  int id;
  Prog *pPStack_18;
  int start_local;
  Prog *prog_local;
  string *s;
  
  local_1d = 0;
  id = start;
  pPStack_18 = prog;
  prog_local = (Prog *)this;
  std::__cxx11::string::string((string *)this);
  for (local_24 = id; uVar1 = local_24, iVar2 = Prog::size(pPStack_18), (int)uVar1 < iVar2;
      local_24 = local_24 + 1) {
    local_40 = Prog::inst(pPStack_18,local_24);
    iVar2 = Prog::Inst::last(local_40);
    uVar1 = local_24;
    if (iVar2 == 0) {
      Prog::Inst::Dump_abi_cxx11_(local_80);
      uVar3 = std::__cxx11::string::c_str();
      StringAppendF((string *)this,"%d+ %s\n",(ulong)uVar1,uVar3);
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      Prog::Inst::Dump_abi_cxx11_(local_60);
      uVar3 = std::__cxx11::string::c_str();
      StringAppendF((string *)this,"%d. %s\n",(ulong)uVar1,uVar3);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  return this;
}

Assistant:

static string FlattenedProgToString(Prog* prog, int start) {
  string s;
  for (int id = start; id < prog->size(); id++) {
    Prog::Inst* ip = prog->inst(id);
    if (ip->last())
      StringAppendF(&s, "%d. %s\n", id, ip->Dump().c_str());
    else
      StringAppendF(&s, "%d+ %s\n", id, ip->Dump().c_str());
  }
  return s;
}